

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

ostream * __thiscall
trompeloeil::
call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
::report_mismatch(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
                  *this,ostream *os,
                 call_params_type_t<int_(float,_const_std::__cxx11::basic_string<char>_&)> *params)

{
  list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *cond;
  
  this->reported = true;
  (*(this->
    super_call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ).
    super_list_elem<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ._vptr_list_elem[6])();
  bVar2 = match_parameters<0ul,1ul,std::tuple<float,char_const*>,std::tuple<float&,std::__cxx11::string_const&>>
                    (&this->val,params);
  if (bVar2) {
    plVar1 = &(this->conditions).
              super_list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ;
    while (plVar1 = plVar1->next,
          plVar1 != &(this->conditions).
                     super_list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
          ) {
      iVar3 = (*plVar1->_vptr_list_elem[2])(plVar1,params);
      if ((char)iVar3 == '\0') {
        poVar4 = std::operator<<(os,"\n  Failed WITH(");
        iVar3 = (*plVar1->_vptr_list_elem[3])(plVar1);
        poVar4 = std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar3));
        std::operator<<(poVar4,')');
      }
    }
  }
  else {
    std::operator<<(os,'\n');
    print_mismatch<float,char_const*,float&,std::__cxx11::string_const&,0ul,1ul>
              (os,&this->val,params);
  }
  return os;
}

Assistant:

std::ostream&
    report_mismatch(
      std::ostream& os,
      call_params_type_t<Sig> const & params)
    override
    {
      reported = true;
      report_signature(os);
      if (match_parameters(val, params))
      {
        for (auto& cond : conditions)
        {
          if (!cond.check(params))
          {
            os << "\n  Failed WITH(" << cond.name() << ')';
          }
        }
      }
      else
      {
        os << '\n';
        ::trompeloeil::print_mismatch(os, val, params);
      }
      return os;
    }